

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::record_pipeline_layout
          (StateRecorder *this,VkPipelineLayout pipeline_layout,
          VkPipelineLayoutCreateInfo *create_info,Hash custom_hash)

{
  bool bVar1;
  mutex *__mutex;
  VkPipelineLayoutCreateInfo *new_info;
  WorkItem local_70;
  string local_50;
  
  __mutex = &this->impl->record_lock;
  std::mutex::lock(__mutex);
  if (create_info->pNext == (void *)0x0) {
    new_info = (VkPipelineLayoutCreateInfo *)0x0;
    bVar1 = Impl::copy_pipeline_layout(this->impl,create_info,&this->impl->temp_allocator,&new_info)
    ;
    if (bVar1) {
      local_70.type = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
      local_70.create_info = new_info;
      local_70.handle = (uint64_t)pipeline_layout;
      local_70.custom_hash = custom_hash;
      Impl::push_work_locked(this->impl,&local_70);
    }
    else {
      Impl::push_unregister_locked<VkPipelineLayout_T*>
                (this->impl,VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,pipeline_layout);
    }
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_50,"pNext in VkPipelineLayoutCreateInfo not supported.",
               (allocator *)&local_70);
    log_error_pnext_chain(&local_50,create_info->pNext);
    std::__cxx11::string::_M_dispose();
    Impl::push_unregister_locked<VkPipelineLayout_T*>
              (this->impl,VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,pipeline_layout);
    bVar1 = false;
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if (bVar1 != false) {
    Impl::pump_synchronized_recording(this->impl,this);
  }
  return bVar1;
}

Assistant:

bool StateRecorder::record_pipeline_layout(VkPipelineLayout pipeline_layout, const VkPipelineLayoutCreateInfo &create_info,
                                           Hash custom_hash)
{
	{
		std::lock_guard<std::mutex> lock(impl->record_lock);

		if (create_info.pNext)
		{
			log_error_pnext_chain("pNext in VkPipelineLayoutCreateInfo not supported.", create_info.pNext);
			// Have to forget any reference if this API handle is recycled.
			impl->push_unregister_locked(VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO, pipeline_layout);
			return false;
		}

		VkPipelineLayoutCreateInfo *new_info = nullptr;
		if (!impl->copy_pipeline_layout(&create_info, impl->temp_allocator, &new_info))
		{
			// Have to forget any reference if this API handle is recycled.
			impl->push_unregister_locked(VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO, pipeline_layout);
			return false;
		}

		impl->push_work_locked({VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO, api_object_cast<uint64_t>(pipeline_layout),
		                        new_info, custom_hash});
	}

	impl->pump_synchronized_recording(this);
	return true;
}